

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O1

void __thiscall
RandomNumberUtil_GetRandomIndexesEmpty_Test::TestBody
          (RandomNumberUtil_GetRandomIndexesEmpty_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  cfd::core::RandomNumberUtil::GetRandomIndexes(&local_20,0);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2);
  local_38.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_30,"indexes.size()","static_cast<size_t>(length)",(unsigned_long *)&local_40,
             (unsigned_long *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x40,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
      local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomIndexesEmpty) {
  uint32_t length = 0;
  std::vector<uint32_t> indexes = RandomNumberUtil::GetRandomIndexes(length);
  EXPECT_EQ(indexes.size(), static_cast<size_t>(length));
}